

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O3

int SHA384_512ResultN(SHA512Context *context,uint8_t *Message_Digest,int HashSize)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 1;
  if ((Message_Digest != (uint8_t *)0x0 && context != (SHA512Context *)0x0) &&
     (iVar1 = context->Corrupted, iVar1 == 0)) {
    if (context->Computed == 0) {
      SHA384_512Finalize(context,0x80);
    }
    if (HashSize < 1) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      uVar2 = 0;
      do {
        Message_Digest[uVar2] =
             (uint8_t)(*(ulong *)((long)context->Intermediate_Hash +
                                 (ulong)((uint)uVar2 & 0xfffffff8)) >>
                      ((byte)(~(uint)uVar2 << 3) & 0x3f));
        uVar2 = uVar2 + 1;
      } while (uVar2 != (uint)HashSize);
    }
  }
  return iVar1;
}

Assistant:

static int SHA384_512ResultN(SHA512Context *context,
    uint8_t Message_Digest[], int HashSize)
{
    int i;

#ifdef USE_32BIT_ONLY
    int i2;
#endif /* USE_32BIT_ONLY */

    if (!context || !Message_Digest)
        return shaNull;

    if (context->Corrupted)
        return context->Corrupted;

    if (!context->Computed)
        SHA384_512Finalize(context, 0x80);

#ifdef USE_32BIT_ONLY
    for (i = i2 = 0; i < HashSize;) {
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 24);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 16);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 8);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2++]);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 24);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 16);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 8);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2++]);
    }
#else /* !USE_32BIT_ONLY */
    for (i = 0; i < HashSize; ++i)
        Message_Digest[i] = (uint8_t)
        (context->Intermediate_Hash[i >> 3] >> 8 * (7 - (i % 8)));
#endif /* USE_32BIT_ONLY */

    return shaSuccess;
}